

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O1

fdb_seqnum_t fdb_kvs_get_committed_seqnum(fdb_kvs_handle *handle)

{
  filemgr *file;
  docio_handle *handle_00;
  fdb_kvs_id_t id;
  long lVar1;
  void *data;
  char *version_00;
  int64_t iVar2;
  size_t len_00;
  __int_type bid;
  bool bVar3;
  long alStack_f0 [9];
  undefined1 auStack_a8 [8];
  docio_object doc;
  bid_t local_68;
  uint64_t dummy64;
  uint64_t kv_info_offset;
  size_t len;
  kvs_header *kv_header;
  char *compacted_filename;
  uint64_t version;
  fdb_seqnum_t seqnum;
  
  version = 0xffffffffffffffff;
  kv_header = (kvs_header *)0x0;
  file = handle->file;
  lVar1 = -((long)file->config->blocksize + 0xfU & 0xfffffffffffffff0);
  if (handle->kvs == (kvs_info *)0x0) {
    bVar3 = true;
  }
  else {
    bVar3 = handle->kvs->id == 0;
  }
  if ((file->header).size == 0) {
    bid = 0xffffffffffffffff;
  }
  else {
    bid = (file->header).bid.super___atomic_base<unsigned_long>._M_i;
  }
  if (bid != 0xffffffffffffffff) {
    *(err_log_callback **)((long)alStack_f0 + lVar1 + 0x40) = &handle->log_callback;
    *(undefined8 *)((long)alStack_f0 + lVar1 + 0x38) = 0;
    *(char ***)((long)alStack_f0 + lVar1 + 0x30) = &compacted_filename;
    *(undefined8 *)((long)alStack_f0 + lVar1 + 0x28) = 0;
    *(undefined8 *)((long)alStack_f0 + lVar1 + 0x20) = 0x13eca8;
    filemgr_fetch_header
              (file,bid,auStack_a8 + lVar1,&kv_info_offset,&version,(filemgr_header_revnum_t *)0x0,
               *(uint64_t **)((long)alStack_f0 + lVar1 + 0x28),
               *(uint64_t **)((long)alStack_f0 + lVar1 + 0x30),
               *(uint64_t **)((long)alStack_f0 + lVar1 + 0x38),
               *(err_log_callback **)((long)alStack_f0 + lVar1 + 0x40));
    version_00 = compacted_filename;
    if (bVar3) {
      return version;
    }
    *(undefined8 *)((long)alStack_f0 + lVar1 + 0x40) = 0;
    *(kvs_header ***)((long)alStack_f0 + lVar1 + 0x38) = &kv_header;
    *(bid_t **)((long)alStack_f0 + lVar1 + 0x30) = &local_68;
    *(uint64_t **)((long)alStack_f0 + lVar1 + 0x28) = &dummy64;
    *(bid_t **)((long)alStack_f0 + lVar1 + 0x20) = &local_68;
    *(bid_t **)((long)alStack_f0 + lVar1 + 0x18) = &local_68;
    *(bid_t **)((long)alStack_f0 + lVar1 + 0x10) = &local_68;
    *(bid_t **)((long)alStack_f0 + lVar1 + 8) = &local_68;
    *(undefined8 *)((long)alStack_f0 + lVar1) = 0x13ece3;
    fdb_fetch_header((uint64_t)version_00,auStack_a8 + lVar1,&local_68,&local_68,&local_68,&local_68
                     ,*(uint64_t **)((long)alStack_f0 + lVar1 + 8),
                     *(uint64_t **)((long)alStack_f0 + lVar1 + 0x10),
                     *(uint64_t **)((long)alStack_f0 + lVar1 + 0x18),
                     *(uint64_t **)((long)alStack_f0 + lVar1 + 0x20),
                     *(uint64_t **)((long)alStack_f0 + lVar1 + 0x28),
                     *(uint64_t **)((long)alStack_f0 + lVar1 + 0x30),
                     *(char ***)((long)alStack_f0 + lVar1 + 0x38),
                     *(char ***)((long)alStack_f0 + lVar1 + 0x40));
    auStack_a8._0_2_ = 0;
    auStack_a8._2_2_ = 0;
    auStack_a8._4_4_ = 0;
    doc.length.keylen = 0;
    doc.length.metalen = 0;
    doc.length.bodylen = 0;
    doc.length._8_8_ = (ulong)(uint)doc.length._12_4_ << 0x20;
    doc.timestamp = 0;
    doc._20_4_ = 0;
    doc.key = (void *)0x0;
    doc.field_3.seqnum = 0;
    doc.meta = (void *)0x0;
    *(undefined8 *)((long)alStack_f0 + lVar1 + 0x40) = 0x13ed13;
    _fdb_kvs_header_create((kvs_header **)&len);
    doc.meta = (void *)0x0;
    doc.key = (void *)0x0;
    doc.field_3.seqnum = 0;
    doc.length.bodylen_ondisk = 0;
    doc.length.flag = '\0';
    doc.length.checksum = '\0';
    doc.length.reserved = 0;
    doc.timestamp = 0;
    doc._20_4_ = 0;
    auStack_a8._0_2_ = 0;
    auStack_a8._2_2_ = 0;
    auStack_a8._4_4_ = 0;
    doc.length.keylen = 0;
    doc.length.metalen = 0;
    doc.length.bodylen = 0;
    handle_00 = handle->dhandle;
    *(undefined8 *)((long)alStack_f0 + lVar1 + 0x40) = 0x13ed3d;
    iVar2 = docio_read_doc(handle_00,dummy64,(docio_object *)auStack_a8,true);
    data = doc.meta;
    if (0 < iVar2) {
      *(undefined8 *)((long)alStack_f0 + lVar1 + 0x40) = 0x13ed63;
      _fdb_kvs_header_import((kvs_header *)len,data,len_00,(uint64_t)compacted_filename,false);
      id = handle->kvs->id;
      *(undefined8 *)((long)alStack_f0 + lVar1 + 0x40) = 0x13ed73;
      version = _fdb_kvs_get_seqnum((kvs_header *)len,id);
      *(undefined8 *)((long)alStack_f0 + lVar1 + 0x40) = 0x13ed7f;
      _fdb_kvs_header_free((kvs_header *)len);
      *(undefined8 *)((long)alStack_f0 + lVar1 + 0x40) = 0x13ed96;
      free_docio_object((docio_object *)auStack_a8,'\x01','\x01','\x01');
      return version;
    }
    *(undefined8 *)((long)alStack_f0 + lVar1 + 0x40) = 0x13eda0;
    _fdb_kvs_header_free((kvs_header *)len);
  }
  return 0;
}

Assistant:

fdb_seqnum_t fdb_kvs_get_committed_seqnum(fdb_kvs_handle *handle)
{
    uint8_t *buf;
    uint64_t dummy64;
    uint64_t version;
    uint64_t kv_info_offset;
    size_t len;
    bid_t hdr_bid;
    fdb_seqnum_t seqnum = SEQNUM_NOT_USED;
    fdb_kvs_id_t id = 0;
    char *compacted_filename = NULL;
    struct filemgr *file = handle->file;

    buf = alca(uint8_t, file->config->blocksize);

    if (handle->kvs && handle->kvs->id > 0) {
        id = handle->kvs->id;
    }

    hdr_bid = filemgr_get_header_bid(file);
    if (hdr_bid == BLK_NOT_FOUND) {
        // header doesn't exist
        return 0;
    }

    // read header
    filemgr_fetch_header(file, hdr_bid, buf, &len, &seqnum, NULL, NULL,
                         &version, NULL, &handle->log_callback);
    if (id > 0) { // non-default KVS
        // read last KVS header
        fdb_fetch_header(version, buf, &dummy64, &dummy64,
                         &dummy64, &dummy64, &dummy64, &dummy64,
                         &dummy64, &dummy64,
                         &kv_info_offset, &dummy64,
                         &compacted_filename, NULL);

        int64_t doc_offset;
        struct kvs_header *kv_header;
        struct docio_object doc;

        _fdb_kvs_header_create(&kv_header);
        memset(&doc, 0, sizeof(struct docio_object));
        doc_offset = docio_read_doc(handle->dhandle,
                                    kv_info_offset, &doc, true);

        if (doc_offset <= 0) {
            // fail
            _fdb_kvs_header_free(kv_header);
            return 0;

        } else {
            _fdb_kvs_header_import(kv_header, doc.body,
                                   doc.length.bodylen, version, false);
            // get local sequence number for the KV instance
            seqnum = _fdb_kvs_get_seqnum(kv_header,
                                         handle->kvs->id);
            _fdb_kvs_header_free(kv_header);
            free_docio_object(&doc, 1, 1, 1);
        }
    }
    return seqnum;
}